

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O2

string * __thiscall
CLIntercept::getShortKernelName_abi_cxx11_
          (string *__return_storage_ptr__,CLIntercept *this,cl_kernel kernel)

{
  mapped_type *__k;
  iterator iVar1;
  mapped_type *pmVar2;
  cl_kernel local_20;
  
  local_20 = kernel;
  __k = std::
        map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
        ::operator[](&this->m_KernelInfoMap,&local_20);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_LongKernelNameMap)._M_h,&__k->KernelName);
  pmVar2 = (mapped_type *)
           ((long)iVar1.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur + 0x28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pmVar2 = __k;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string CLIntercept::getShortKernelName(
    const cl_kernel kernel )
{
    const std::string& realKernelName = m_KernelInfoMap[ kernel ].KernelName;

    CLongKernelNameMap::const_iterator i = m_LongKernelNameMap.find( realKernelName );

    const std::string& shortKernelName =
        ( i != m_LongKernelNameMap.end() ) ?
        i->second :
        realKernelName;

    CLI_ASSERT( shortKernelName.length() <= m_Config.LongKernelNameCutoff );

    return shortKernelName;
}